

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_GNUIKIND_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  switch(val) {
  case 0:
    *s_out = "DW_GNUIKIND_none";
    s_out_local._4_4_ = 0;
    break;
  case 1:
    *s_out = "DW_GNUIKIND_type";
    s_out_local._4_4_ = 0;
    break;
  case 2:
    *s_out = "DW_GNUIKIND_variable";
    s_out_local._4_4_ = 0;
    break;
  case 3:
    *s_out = "DW_GNUIKIND_function";
    s_out_local._4_4_ = 0;
    break;
  case 4:
    *s_out = "DW_GNUIKIND_other";
    s_out_local._4_4_ = 0;
    break;
  default:
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_GNUIKIND_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_GNUIKIND_none:
        *s_out = "DW_GNUIKIND_none";
        return DW_DLV_OK;
    case DW_GNUIKIND_type:
        *s_out = "DW_GNUIKIND_type";
        return DW_DLV_OK;
    case DW_GNUIKIND_variable:
        *s_out = "DW_GNUIKIND_variable";
        return DW_DLV_OK;
    case DW_GNUIKIND_function:
        *s_out = "DW_GNUIKIND_function";
        return DW_DLV_OK;
    case DW_GNUIKIND_other:
        *s_out = "DW_GNUIKIND_other";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}